

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O0

string * __thiscall
cmCTestGIT::FindGitDir_abi_cxx11_(string *__return_storage_ptr__,cmCTestGIT *this)

{
  bool bVar1;
  ulong uVar2;
  char *pcVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_140;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_120;
  undefined1 local_100 [8];
  OutputLogger rev_parse_err;
  undefined1 local_b0 [8];
  OneLineParser rev_parse_out;
  string git_dir_line;
  char *git_rev_parse [4];
  char *git;
  cmCTestGIT *this_local;
  string *git_dir;
  
  std::__cxx11::string::string((string *)__return_storage_ptr__);
  git_dir_line.field_2._8_8_ = std::__cxx11::string::c_str();
  std::__cxx11::string::string((string *)&rev_parse_out.Line1);
  OneLineParser::OneLineParser
            ((OneLineParser *)local_b0,this,"rev-parse-out> ",(string *)&rev_parse_out.Line1);
  cmProcessTools::OutputLogger::OutputLogger
            ((OutputLogger *)local_100,(this->super_cmCTestGlobalVC).super_cmCTestVC.Log,
             "rev-parse-err> ");
  bVar1 = cmCTestVC::RunChild((cmCTestVC *)this,(char **)((long)&git_dir_line.field_2 + 8),
                              (OutputParser *)local_b0,(OutputParser *)local_100,(char *)0x0);
  if (bVar1) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&rev_parse_out.Line1)
    ;
  }
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,".git");
  }
  pcVar3 = (char *)std::__cxx11::string::operator[]((ulong)__return_storage_ptr__);
  if (*pcVar3 == '.') {
    std::operator+(&local_140,&(this->super_cmCTestGlobalVC).super_cmCTestVC.SourceDirectory,"/");
    std::operator+(&local_120,&local_140,__return_storage_ptr__);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_120);
    std::__cxx11::string::~string((string *)&local_120);
    std::__cxx11::string::~string((string *)&local_140);
  }
  cmProcessTools::OutputLogger::~OutputLogger((OutputLogger *)local_100);
  OneLineParser::~OneLineParser((OneLineParser *)local_b0);
  std::__cxx11::string::~string((string *)&rev_parse_out.Line1);
  return __return_storage_ptr__;
}

Assistant:

std::string cmCTestGIT::FindGitDir()
{
  std::string git_dir;

  // Run "git rev-parse --git-dir" to locate the real .git directory.
  const char* git = this->CommandLineTool.c_str();
  char const* git_rev_parse[] = {git, "rev-parse", "--git-dir", 0};
  std::string git_dir_line;
  OneLineParser rev_parse_out(this, "rev-parse-out> ", git_dir_line);
  OutputLogger rev_parse_err(this->Log, "rev-parse-err> ");
  if(this->RunChild(git_rev_parse, &rev_parse_out, &rev_parse_err))
    {
    git_dir = git_dir_line;
    }
  if(git_dir.empty())
    {
    git_dir = ".git";
    }

  // Git reports a relative path only when the .git directory is in
  // the current directory.
  if(git_dir[0] == '.')
    {
    git_dir = this->SourceDirectory + "/" + git_dir;
    }
#if defined(_WIN32) && !defined(__CYGWIN__)
  else if(git_dir[0] == '/')
    {
    // Cygwin Git reports a full path that Cygwin understands, but we
    // are a Windows application.  Run "cygpath" to get Windows path.
    std::string cygpath_exe = cmSystemTools::GetFilenamePath(git);
    cygpath_exe += "/cygpath.exe";
    if(cmSystemTools::FileExists(cygpath_exe.c_str()))
      {
      char const* cygpath[] = {cygpath_exe.c_str(), "-w", git_dir.c_str(), 0};
      OneLineParser cygpath_out(this, "cygpath-out> ", git_dir_line);
      OutputLogger cygpath_err(this->Log, "cygpath-err> ");
      if(this->RunChild(cygpath, &cygpath_out, &cygpath_err))
        {
        git_dir = git_dir_line;
        }
      }
    }
#endif
  return git_dir;
}